

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsGear.cpp
# Opt level: O1

void __thiscall chrono::ChShaftsGear::ChShaftsGear(ChShaftsGear *this,ChShaftsGear *other)

{
  undefined1 auVar1 [64];
  
  ChPhysicsItem::ChPhysicsItem((ChPhysicsItem *)this,(ChPhysicsItem *)other);
  (this->super_ChShaftsCouple).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsGear_00b4a010;
  this->violation = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.c_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.l_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.cfm_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.broken = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.active = true;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.g_i = 0.0;
  (this->constraint).super_ChConstraintTwo.variables_a = (ChVariables *)SUB168(ZEXT416(0) << 0x40,0)
  ;
  (this->constraint).super_ChConstraintTwo.variables_b = (ChVariables *)SUB168(ZEXT416(0) << 0x40,8)
  ;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoGeneric_00b62c70;
  auVar1 = ZEXT464(0) << 0x40;
  (this->constraint).Cq_a = (ChRowVectorDynamic<double>)auVar1._0_16_;
  (this->constraint).Cq_b = (ChRowVectorDynamic<double>)auVar1._16_16_;
  (this->constraint).Eq_a = (ChVectorDynamic<double>)auVar1._32_16_;
  (this->constraint).Eq_b = (ChVectorDynamic<double>)auVar1._48_16_;
  this->ratio = other->ratio;
  this->torque_react = other->torque_react;
  this->avoid_phase_drift = other->avoid_phase_drift;
  this->phase1 = other->phase1;
  this->phase2 = other->phase2;
  return;
}

Assistant:

ChShaftsGear::ChShaftsGear(const ChShaftsGear& other) : ChShaftsCouple(other), violation(0) {
    ratio = other.ratio;
    torque_react = other.torque_react;
    avoid_phase_drift = other.avoid_phase_drift;
    phase1 = other.phase1;
    phase2 = other.phase2;
}